

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

apx_error_t apx_vm_select_program(apx_vm_t *self,apx_program_t *program)

{
  uint32_t size;
  uint8_t *data;
  apx_error_t local_30;
  apx_error_t result;
  uint32_t program_size;
  uint8_t *program_begin;
  apx_program_t *program_local;
  apx_vm_t *self_local;
  
  if ((self == (apx_vm_t *)0x0) || (program == (apx_program_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    data = adt_bytearray_data(program);
    size = adt_bytearray_length(program);
    local_30 = apx_vm_decoder_select_program(&self->decoder,data,size);
    if (local_30 == 0) {
      local_30 = apx_vm_decoder_parse_program_header(&self->decoder,&self->program_header);
    }
    self_local._4_4_ = local_30;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_select_program(apx_vm_t* self, apx_program_t const* program)
{
   if ( (self != NULL) && (program != NULL) )
   {
      uint8_t const* program_begin = adt_bytearray_data(program);
      uint32_t const program_size = adt_bytearray_length(program);
      apx_error_t result = apx_vm_decoder_select_program(&self->decoder,program_begin, program_size);
      if (result == APX_NO_ERROR)
      {
         result = apx_vm_decoder_parse_program_header(&self->decoder, &self->program_header);
      }
      return result;

   }
   return APX_INVALID_ARGUMENT_ERROR;
}